

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

void deqp::gls::StateQueryUtil::verifyStateIntegerEqualToOther
               (ResultCollector *result,CallLogWrapper *gl,GLenum target,GLenum other,QueryType type
               )

{
  allocator<char> local_a9;
  ResultCollector *local_a8;
  string local_a0;
  QueriedState stateB;
  QueriedState stateA;
  
  stateB.m_type = DATATYPE_LAST;
  stateA.m_type = stateB.m_type;
  queryState(result,gl,type,target,&stateA);
  local_a8 = result;
  queryState(result,gl,type,other,&stateB);
  if ((stateA.m_type != DATATYPE_LAST) && (stateB.m_type != DATATYPE_LAST)) {
    switch(type) {
    case QUERY_BOOLEAN:
      if (stateA.m_v.vBool == stateB.m_v.vBool) {
        return;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"expected equal results",&local_a9);
      tcu::ResultCollector::fail(local_a8,&local_a0);
      break;
    default:
      goto switchD_00456d12_caseD_1;
    case QUERY_INTEGER:
      if (stateA.m_v.vInt == stateB.m_v.vInt) {
        return;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"expected equal results",&local_a9);
      tcu::ResultCollector::fail(local_a8,&local_a0);
      break;
    case QUERY_INTEGER64:
      if (CONCAT44(stateA.m_v.vIntVec3[1],stateA.m_v.vInt) ==
          CONCAT44(stateB.m_v.vIntVec3[1],stateB.m_v.vInt)) {
        return;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"expected equal results",&local_a9);
      tcu::ResultCollector::fail(local_a8,&local_a0);
      break;
    case QUERY_FLOAT:
      if ((stateA.m_v.vFloat == stateB.m_v.vFloat) &&
         (!NAN(stateA.m_v.vFloat) && !NAN(stateB.m_v.vFloat))) {
        return;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"expected equal results",&local_a9);
      tcu::ResultCollector::fail(local_a8,&local_a0);
    }
    std::__cxx11::string::~string((string *)&local_a0);
  }
switchD_00456d12_caseD_1:
  return;
}

Assistant:

void verifyStateIntegerEqualToOther (tcu::ResultCollector& result, glu::CallLogWrapper& gl, glw::GLenum target, glw::GLenum other, QueryType type)
{
	QueriedState stateA;
	QueriedState stateB;

	queryState(result, gl, type, target, stateA);
	queryState(result, gl, type, other, stateB);

	if (stateA.isUndefined() || stateB.isUndefined())
		return;

	switch (type)
	{
		case QUERY_BOOLEAN:
		{
			if (stateA.getBoolAccess() != stateB.getBoolAccess())
				result.fail("expected equal results");
			break;
		}

		case QUERY_INTEGER:
		{
			if (stateA.getIntAccess() != stateB.getIntAccess())
				result.fail("expected equal results");
			break;
		}

		case QUERY_INTEGER64:
		{
			if (stateA.getInt64Access() != stateB.getInt64Access())
				result.fail("expected equal results");
			break;
		}

		case QUERY_FLOAT:
		{
			if (stateA.getFloatAccess() != stateB.getFloatAccess())
				result.fail("expected equal results");
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}